

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O1

bool __thiscall asl::HttpMessage::sendHeaders(HttpMessage *this)

{
  KeyVal *pKVar1;
  SmartObject_ *pSVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  anon_union_16_2_78e7fdac_for_String_2 *paVar8;
  undefined8 s_00;
  long lVar9;
  KeyVal *pKVar10;
  String s;
  String contentlength;
  String local_78;
  String local_60;
  String local_48;
  
  local_78.field_2._space[0] = '\0';
  local_78._size = 0;
  local_78._len = 0;
  if ((this->_command)._size == 0) {
    paVar8 = &(this->_command).field_2;
  }
  else {
    paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_command).field_2._str;
  }
  String::append(&local_78,paVar8->_space,(this->_command)._len);
  String::append(&local_78,"\r\n",2);
  pKVar10 = (this->_headers).super_Map<asl::String,_asl::String>.a._a;
  if (0 < *(int *)&pKVar10[-1].value.field_2) {
    lVar9 = 0x20;
    lVar6 = 0;
    do {
      pKVar1 = (this->_headers).super_Map<asl::String,_asl::String>.a._a;
      if (*(int *)((long)pKVar1 + lVar9 + -0x20) == 0) {
        pcVar7 = (char *)((long)pKVar1 + lVar9 + -0x18);
      }
      else {
        pcVar7 = *(char **)((long)pKVar1 + lVar9 + -0x18);
      }
      String::append(&local_78,pcVar7,*(int *)((long)pKVar1 + lVar9 + -0x1c));
      String::append(&local_78,": ",2);
      if (*(int *)((long)pKVar10 + lVar9 + -8) == 0) {
        pcVar7 = (char *)((long)&(pKVar10->key)._size + lVar9);
      }
      else {
        pcVar7 = *(char **)((long)&(pKVar10->key)._size + lVar9);
      }
      String::append(&local_78,pcVar7,*(int *)((long)pKVar10 + lVar9 + -4));
      String::append(&local_78,"\r\n",2);
      lVar6 = lVar6 + 1;
      pKVar10 = (this->_headers).super_Map<asl::String,_asl::String>.a._a;
      lVar9 = lVar9 + 0x30;
    } while (lVar6 < *(int *)&pKVar10[-1].value.field_2);
  }
  String::append(&local_78,"\r\n",2);
  if (local_78._size == 0) {
    paVar8 = &local_78.field_2;
  }
  else {
    paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)
             CONCAT71(local_78.field_2._1_7_,local_78.field_2._space[0]);
  }
  pSVar2 = (this->_socket->super_SmartObject)._p;
  iVar4 = (*pSVar2->_vptr_SmartObject_[0xe])(pSVar2,paVar8,(ulong)local_78._0_8_ >> 0x20);
  iVar3 = local_78._len;
  if (local_78._len <= iVar4) {
    this->_headersSent = true;
    String::String(&local_48,"Content-Length");
    header(&local_60,this,&local_48);
    if (local_48._size != 0) {
      free(local_48.field_2._str);
    }
    this->_chunked = local_60._len < 1;
    if (local_60._len < 1) {
      iVar5 = 0;
    }
    else {
      s_00 = local_60.field_2._str;
      if (local_60._size == 0) {
        s_00 = &local_60.field_2;
      }
      iVar5 = myatoi((char *)s_00);
    }
    ((this->_status)._p)->p->totalSend = iVar5;
    if (local_60._size != 0) {
      free(local_60.field_2._str);
    }
  }
  if (local_78._size != 0) {
    free((void *)CONCAT71(local_78.field_2._1_7_,local_78.field_2._space[0]));
  }
  return iVar3 <= iVar4;
}

Assistant:

bool HttpMessage::sendHeaders()
{
	String s;
	s << _command << "\r\n";
	foreach2(String& name, String& value, _headers)
	{
		s << name << ": " << value << "\r\n";
	}
	s << "\r\n";
	int sent = _socket->write(*s, s.length());
	if (sent < s.length())
		return false;
	_headersSent = true;
	String contentlength = header("Content-Length");
	_chunked = !contentlength.ok();
	_status->totalSend = _chunked ? 0 : int(contentlength);
	return true;
}